

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_font.cpp
# Opt level: O0

void Timidity::font_add(char *filename,int load_order)

{
  FontFile *pFVar1;
  FileReader *f;
  FileReader *fp;
  FontFile *font;
  int load_order_local;
  char *filename_local;
  
  pFVar1 = font_find(filename);
  if (pFVar1 == (FontFile *)0x0) {
    f = PathExpander::openFileReader((PathExpander *)pathExpander,filename,(int *)0x0);
    if (f != (FileReader *)0x0) {
      fp = (FileReader *)ReadSF2(filename,f);
      if (((SFFile *)fp != (SFFile *)0x0) ||
         (fp = (FileReader *)ReadDLS(filename,f), fp != (FileReader *)0x0)) {
        (*(fp->super_FileReaderBase)._vptr_FileReaderBase[5])(fp,(ulong)(uint)load_order);
      }
      if (f != (FileReader *)0x0) {
        (*(f->super_FileReaderBase)._vptr_FileReaderBase[1])();
      }
    }
  }
  else {
    (*pFVar1->_vptr_FontFile[5])(pFVar1,(ulong)(uint)load_order);
  }
  return;
}

Assistant:

void font_add(const char *filename, int load_order)
{
	FontFile *font;

	font = font_find(filename);
	if (font != NULL)
	{
		font->SetAllOrders(load_order);
	}
	else
	{
		FileReader *fp = pathExpander.openFileReader(filename, NULL);

		if (fp != NULL)
		{
			if ((font = ReadSF2(filename, fp)) || (font = ReadDLS(filename, fp)))
			{
				font->SetAllOrders(load_order);
			}
			delete fp;
		}
	}
}